

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_object_dotremove_internal(JSON_Object *object,char *name,parson_bool_t free_value)

{
  JSON_Status JVar1;
  JSON_Value_Type JVar2;
  char *pcVar3;
  JSON_Value *value;
  undefined4 in_EDX;
  JSON_Object *in_RSI;
  char *in_RDI;
  char *dot_pos;
  JSON_Object *temp_object;
  JSON_Value *temp_value;
  char *in_stack_00000030;
  JSON_Object *in_stack_00000038;
  JSON_Value *value_00;
  parson_bool_t free_value_00;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  value_00 = (JSON_Value *)0x0;
  pcVar3 = strchr((char *)in_RSI,0x2e);
  if (pcVar3 == (char *)0x0) {
    JVar1 = json_object_remove_internal(in_stack_00000038,in_stack_00000030,object._4_4_);
  }
  else {
    value = json_object_getn_value
                      ((JSON_Object *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       in_RDI,(size_t)in_RSI);
    JVar2 = json_value_get_type(value);
    free_value_00 = (parson_bool_t)((ulong)value >> 0x20);
    if (JVar2 == 4) {
      json_value_get_object(value_00);
      JVar1 = json_object_dotremove_internal
                        (in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),free_value_00);
    }
    else {
      JVar1 = -1;
    }
  }
  return JVar1;
}

Assistant:

static JSON_Status json_object_dotremove_internal(JSON_Object *object, const char *name, parson_bool_t free_value) {
    JSON_Value *temp_value = NULL;
    JSON_Object *temp_object = NULL;
    const char *dot_pos = strchr(name, '.');
    if (!dot_pos) {
        return json_object_remove_internal(object, name, free_value);
    }
    temp_value = json_object_getn_value(object, name, dot_pos - name);
    if (json_value_get_type(temp_value) != JSONObject) {
        return JSONFailure;
    }
    temp_object = json_value_get_object(temp_value);
    return json_object_dotremove_internal(temp_object, dot_pos + 1, free_value);
}